

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

void __thiscall
boost::detail::shared_count::
shared_count<boost::runtime::parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0,true>>
          (shared_count *this,
          parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *p)

{
  _func_int **pp_Var1;
  sp_counted_impl_p<boost::runtime::parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>_>
  *in_RDI;
  parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>
  *in_stack_ffffffffffffffc8;
  
  (in_RDI->super_sp_counted_base)._vptr_sp_counted_base = (_func_int **)0x0;
  pp_Var1 = (_func_int **)operator_new(0x18);
  sp_counted_impl_p<boost::runtime::parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>_>
  ::sp_counted_impl_p(in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super_sp_counted_base)._vptr_sp_counted_base = pp_Var1;
  return;
}

Assistant:

explicit shared_count( Y * p ): pi_( 0 )
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        , id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_p<Y>( p );
        }
        catch(...)
        {
            boost::checked_delete( p );
            throw;
        }

#else

        pi_ = new sp_counted_impl_p<Y>( p );

        if( pi_ == 0 )
        {
            boost::checked_delete( p );
            boost::throw_exception( std::bad_alloc() );
        }

#endif
    }